

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_coding.c
# Opt level: O0

int WebRtcIsac_EncodeSpec
              (int16_t *fr,int16_t *fi,int16_t AvgPitchGain_Q12,ISACBand band,Bitstr *streamdata)

{
  int iVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  int16_t iVar6;
  int iVar7;
  uint32_t uVar8;
  byte bVar9;
  short *psVar10;
  short *psVar11;
  bool local_d09;
  int local_d04;
  ushort local_d00;
  int num_dft_coeff;
  int is_12khz;
  int i;
  int j;
  int n;
  int k;
  int shift_var;
  uint32_t nrg_u32;
  int iStack_cdc;
  int16_t err;
  int32_t newRes;
  int32_t in_sqrt;
  uint32_t sum;
  int32_t res;
  int32_t nrg;
  int16_t val;
  int32_t gain2_Q10;
  undefined1 auStack_cbc [2];
  int16_t ARCoefQ12 [7];
  int16_t RCQ15 [6];
  int32_t CorrQ7_norm [7];
  int32_t CorrQ7 [7];
  uint16_t invARSpecQ8 [120];
  int32_t invARSpec2_Q16 [120];
  int32_t PSpec [120];
  int16_t dataQ7 [480];
  int16_t ditherQ7 [480];
  Bitstr *streamdata_local;
  ISACBand band_local;
  int16_t AvgPitchGain_Q12_local;
  int16_t *fi_local;
  int16_t *fr_local;
  
  local_d00 = 0;
  local_d04 = 0x1e0;
  if (band == kIsacLowerBand) {
    GenerateDitherQ7Lb(dataQ7 + 0x1dc,streamdata->W_upper,0x1e0,AvgPitchGain_Q12);
  }
  else {
    GenerateDitherQ7LbUB(dataQ7 + 0x1dc,streamdata->W_upper,0x1e0);
    if (band == kIsacUpperBand12) {
      local_d04 = 0xf0;
    }
    local_d00 = (ushort)(band == kIsacUpperBand12);
  }
  _band_local = fi;
  fi_local = fr;
  if (band == kIsacLowerBand) {
    for (j = 0; j < 0x1e0; j = j + 4) {
      psVar10 = fi_local + 1;
      sVar2 = (*fi_local + dataQ7[(long)j + 0x1dc] + 0x40U & 0xff80) - dataQ7[(long)j + 0x1dc];
      dataQ7[(long)j + -4] = sVar2;
      psVar11 = _band_local + 1;
      sVar3 = (*_band_local + dataQ7[(long)(j + 1) + 0x1dc] + 0x40U & 0xff80) -
              dataQ7[(long)(j + 1) + 0x1dc];
      dataQ7[(long)(j + 1) + -4] = sVar3;
      fi_local = fi_local + 2;
      sVar4 = (*psVar10 + dataQ7[(long)(j + 2) + 0x1dc] + 0x40U & 0xff80) -
              dataQ7[(long)(j + 2) + 0x1dc];
      dataQ7[(long)(j + 2) + -4] = sVar4;
      _band_local = _band_local + 2;
      sVar5 = (*psVar11 + dataQ7[(long)(j + 3) + 0x1dc] + 0x40U & 0xff80) -
              dataQ7[(long)(j + 3) + 0x1dc];
      dataQ7[(long)(j + 3) + -4] = sVar5;
      invARSpec2_Q16[(long)(j >> 2) + 0x76] =
           (uint)((int)sVar5 * (int)sVar5 +
                 (int)sVar4 * (int)sVar4 + (int)sVar3 * (int)sVar3 + (int)sVar2 * (int)sVar2) >> 2;
    }
  }
  else if (band == kIsacUpperBand12) {
    is_12khz = 0;
    for (j = 0; j < 0xf0; j = j + 4) {
      psVar10 = fi_local + 1;
      sVar2 = (*fi_local + dataQ7[(long)j + 0x1dc] + 0x40U & 0xff80) - dataQ7[(long)j + 0x1dc];
      dataQ7[(long)j + -4] = sVar2;
      psVar11 = _band_local + 1;
      sVar3 = (*_band_local + dataQ7[(long)(j + 1) + 0x1dc] + 0x40U & 0xff80) -
              dataQ7[(long)(j + 1) + 0x1dc];
      dataQ7[(long)(j + 1) + -4] = sVar3;
      iVar7 = is_12khz + 1;
      invARSpec2_Q16[(long)is_12khz + 0x76] =
           (uint)((int)sVar3 * (int)sVar3 + (int)sVar2 * (int)sVar2) >> 1;
      fi_local = fi_local + 2;
      sVar2 = (*psVar10 + dataQ7[(long)(j + 2) + 0x1dc] + 0x40U & 0xff80) -
              dataQ7[(long)(j + 2) + 0x1dc];
      dataQ7[(long)(j + 2) + -4] = sVar2;
      _band_local = _band_local + 2;
      sVar3 = (*psVar11 + dataQ7[(long)(j + 3) + 0x1dc] + 0x40U & 0xff80) -
              dataQ7[(long)(j + 3) + 0x1dc];
      dataQ7[(long)(j + 3) + -4] = sVar3;
      is_12khz = is_12khz + 2;
      invARSpec2_Q16[(long)iVar7 + 0x76] =
           (uint)((int)sVar3 * (int)sVar3 + (int)sVar2 * (int)sVar2) >> 1;
    }
  }
  else if (band == kIsacUpperBand16) {
    is_12khz = 0;
    for (j = 0; j < 0x1e0; j = j + 4) {
      sVar2 = (fr[is_12khz] + dataQ7[(long)j + 0x1dc] + 0x40U & 0xff80) - dataQ7[(long)j + 0x1dc];
      dataQ7[(long)j + -4] = sVar2;
      sVar3 = (fi[is_12khz] + dataQ7[(long)(j + 1) + 0x1dc] + 0x40U & 0xff80) -
              dataQ7[(long)(j + 1) + 0x1dc];
      dataQ7[(long)(j + 1) + -4] = sVar3;
      sVar4 = (fr[0xef - is_12khz] + dataQ7[(long)(j + 2) + 0x1dc] + 0x40U & 0xff80) -
              dataQ7[(long)(j + 2) + 0x1dc];
      dataQ7[(long)(j + 2) + -4] = sVar4;
      sVar5 = (fi[0xef - is_12khz] + dataQ7[(long)(j + 3) + 0x1dc] + 0x40U & 0xff80) -
              dataQ7[(long)(j + 3) + 0x1dc];
      dataQ7[(long)(j + 3) + -4] = sVar5;
      invARSpec2_Q16[(long)(j >> 2) + 0x76] =
           (uint)((int)sVar5 * (int)sVar5 +
                 (int)sVar4 * (int)sVar4 + (int)sVar3 * (int)sVar3 + (int)sVar2 * (int)sVar2) >> 2;
      is_12khz = is_12khz + 1;
    }
  }
  FindCorrelation(invARSpec2_Q16 + 0x76,CorrQ7_norm + 6);
  iVar6 = WebRtcSpl_NormW32(CorrQ7_norm[6]);
  iVar7 = iVar6 + -0x12;
  bVar9 = (byte)iVar7;
  if (iVar7 < 1) {
    for (j = 0; j < 7; j = j + 1) {
      CorrQ7_norm[(long)j + -2] = CorrQ7_norm[(long)j + 6] >> (-bVar9 & 0x1f);
    }
  }
  else {
    for (j = 0; j < 7; j = j + 1) {
      CorrQ7_norm[(long)j + -2] = CorrQ7_norm[(long)j + 6] << (bVar9 & 0x1f);
    }
  }
  WebRtcSpl_AutoCorrToReflCoef((int32_t *)(RCQ15 + 2),6,ARCoefQ12 + 3);
  WebRtcIsac_EncodeRc(ARCoefQ12 + 3,streamdata);
  WebRtcSpl_ReflCoefToLpc(ARCoefQ12 + 3,6,&val);
  sum = 0;
  for (is_12khz = 0; is_12khz < 7; is_12khz = is_12khz + 1) {
    for (i = 0; iVar1 = is_12khz, i <= is_12khz; i = i + 1) {
      sum = ((int)(&val)[is_12khz] *
             (CorrQ7_norm[(long)(is_12khz - i) + -2] * (int)(&val)[i] + 0x100 >> 9) + 4 >> 3) + sum;
    }
    while (i = iVar1 + 1, i < 7) {
      sum = ((int)(&val)[is_12khz] *
             (CorrQ7_norm[(long)(i - is_12khz) + -2] * (int)(&val)[i] + 0x100 >> 9) + 4 >> 3) + sum;
      iVar1 = i;
    }
  }
  if (iVar7 < 1) {
    k = sum << (-bVar9 & 0x1f);
  }
  else {
    k = sum >> (bVar9 & 0x1f);
  }
  if ((uint)k < 0x80000000) {
    sum = k;
  }
  else {
    sum = 0x7fffffff;
  }
  nrg = WebRtcSpl_DivResultInQ31(0x78,sum);
  iVar7 = WebRtcIsac_EncodeGain2(&nrg,streamdata);
  if (iVar7 == 0) {
    FindInvArSpec(&val,nrg,(int32_t *)(invARSpecQ8 + 0x74));
    iVar6 = WebRtcSpl_GetSizeInBits(invARSpecQ8._232_4_);
    in_sqrt = 1 << ((byte)(iVar6 >> 1) & 0x1f);
    for (j = 0; j < 0x78; j = j + 1) {
      iStack_cdc = invARSpec2_Q16[(long)j + -2];
      num_dft_coeff = 10;
      if (iStack_cdc < 0) {
        iStack_cdc = -iStack_cdc;
      }
      nrg_u32 = iStack_cdc / in_sqrt + in_sqrt >> 1;
      do {
        iVar7 = num_dft_coeff;
        in_sqrt = nrg_u32;
        uVar8 = (int)(iStack_cdc / (int)nrg_u32 + nrg_u32) >> 1;
        if (uVar8 != nrg_u32) {
          num_dft_coeff = num_dft_coeff + -1;
        }
        local_d09 = uVar8 != nrg_u32 && 0 < iVar7;
        nrg_u32 = uVar8;
      } while (local_d09);
      *(short *)((long)CorrQ7 + (long)j * 2 + 0x18) = (short)uVar8;
    }
    iVar7 = WebRtcIsac_EncLogisticMulti2
                      (streamdata,(int16_t *)(PSpec + 0x76),(uint16_t *)(CorrQ7 + 6),local_d04,
                       local_d00);
    if ((short)iVar7 < 0) {
      fr_local._4_4_ = (int)(short)iVar7;
    }
    else {
      fr_local._4_4_ = 0;
    }
  }
  else {
    fr_local._4_4_ = -1;
  }
  return fr_local._4_4_;
}

Assistant:

int WebRtcIsac_EncodeSpec(const int16_t* fr, const int16_t* fi,
                          int16_t AvgPitchGain_Q12, enum ISACBand band,
                          Bitstr* streamdata) {
  int16_t ditherQ7[FRAMESAMPLES];
  int16_t dataQ7[FRAMESAMPLES];
  int32_t PSpec[FRAMESAMPLES_QUARTER];
  int32_t invARSpec2_Q16[FRAMESAMPLES_QUARTER];
  uint16_t invARSpecQ8[FRAMESAMPLES_QUARTER];
  int32_t CorrQ7[AR_ORDER + 1];
  int32_t CorrQ7_norm[AR_ORDER + 1];
  int16_t RCQ15[AR_ORDER];
  int16_t ARCoefQ12[AR_ORDER + 1];
  int32_t gain2_Q10;
  int16_t val;
  int32_t nrg, res;
  uint32_t sum;
  int32_t in_sqrt;
  int32_t newRes;
  int16_t err;
  uint32_t nrg_u32;
  int shift_var;
  int k, n, j, i;
  int is_12khz = !kIsSWB12;
  int num_dft_coeff = FRAMESAMPLES;

  /* Create dither signal. */
  if (band == kIsacLowerBand) {
    GenerateDitherQ7Lb(ditherQ7, streamdata->W_upper, FRAMESAMPLES,
                       AvgPitchGain_Q12);
  } else {
    GenerateDitherQ7LbUB(ditherQ7, streamdata->W_upper, FRAMESAMPLES);
    if (band == kIsacUpperBand12) {
      is_12khz = kIsSWB12;
      num_dft_coeff = FRAMESAMPLES_HALF;
    }
  }

  /* add dither and quantize, and compute power spectrum */
  switch (band) {
    case kIsacLowerBand: {
      for (k = 0; k < FRAMESAMPLES; k += 4) {
        val = ((*fr++ + ditherQ7[k]   + 64) & 0xFF80) - ditherQ7[k];
        dataQ7[k] = val;
        sum = val * val;

        val = ((*fi++ + ditherQ7[k + 1] + 64) & 0xFF80) - ditherQ7[k + 1];
        dataQ7[k + 1] = val;
        sum += val * val;

        val = ((*fr++ + ditherQ7[k + 2] + 64) & 0xFF80) - ditherQ7[k + 2];
        dataQ7[k + 2] = val;
        sum += val * val;

        val = ((*fi++ + ditherQ7[k + 3] + 64) & 0xFF80) - ditherQ7[k + 3];
        dataQ7[k + 3] = val;
        sum += val * val;

        PSpec[k >> 2] = sum >> 2;
      }
      break;
    }
    case kIsacUpperBand12: {
      for (k = 0, j = 0; k < FRAMESAMPLES_HALF; k += 4) {
        val = ((*fr++ + ditherQ7[k]   + 64) & 0xFF80) - ditherQ7[k];
        dataQ7[k] = val;
        sum = val * val;

        val = ((*fi++ + ditherQ7[k + 1] + 64) & 0xFF80) - ditherQ7[k + 1];
        dataQ7[k + 1] = val;
        sum += val * val;

        PSpec[j++] = sum >> 1;

        val = ((*fr++ + ditherQ7[k + 2] + 64) & 0xFF80) - ditherQ7[k + 2];
        dataQ7[k + 2] = val;
        sum = val * val;

        val = ((*fi++ + ditherQ7[k + 3] + 64) & 0xFF80) - ditherQ7[k + 3];
        dataQ7[k + 3] = val;
        sum += val * val;

        PSpec[j++] = sum >> 1;
      }
      break;
    }
    case kIsacUpperBand16: {
      for (j = 0, k = 0; k < FRAMESAMPLES; k += 4, j++) {
        val = ((fr[j] + ditherQ7[k]   + 64) & 0xFF80) - ditherQ7[k];
        dataQ7[k] = val;
        sum = val * val;

        val = ((fi[j] + ditherQ7[k + 1] + 64) & 0xFF80) - ditherQ7[k + 1];
        dataQ7[k + 1] = val;
        sum += val * val;

        val = ((fr[(FRAMESAMPLES_HALF) - 1 - j] + ditherQ7[k + 2] + 64) &
            0xFF80) - ditherQ7[k + 2];
        dataQ7[k + 2] = val;
        sum += val * val;

        val = ((fi[(FRAMESAMPLES_HALF) - 1 - j] + ditherQ7[k + 3] + 64) &
            0xFF80) - ditherQ7[k + 3];
        dataQ7[k + 3] = val;
        sum += val * val;

        PSpec[k >> 2] = sum >> 2;
      }
      break;
    }
  }

  /* compute correlation from power spectrum */
  FindCorrelation(PSpec, CorrQ7);

  /* Find AR coefficients */
  /* Aumber of bit shifts to 14-bit normalize CorrQ7[0]
   * (leaving room for sign) */
  shift_var = WebRtcSpl_NormW32(CorrQ7[0]) - 18;

  if (shift_var > 0) {
    for (k = 0; k < AR_ORDER + 1; k++) {
      CorrQ7_norm[k] = CorrQ7[k] << shift_var;
    }
  } else {
    for (k = 0; k < AR_ORDER + 1; k++) {
      CorrQ7_norm[k] = CorrQ7[k] >> (-shift_var);
    }
  }

  /* Find RC coefficients. */
  WebRtcSpl_AutoCorrToReflCoef(CorrQ7_norm, AR_ORDER, RCQ15);

  /* Quantize & code RC Coefficient. */
  WebRtcIsac_EncodeRc(RCQ15, streamdata);

  /* RC -> AR coefficients */
  WebRtcSpl_ReflCoefToLpc(RCQ15, AR_ORDER, ARCoefQ12);

  /* Compute ARCoef' * Corr * ARCoef in Q19. */
  nrg = 0;
  for (j = 0; j <= AR_ORDER; j++) {
    for (n = 0; n <= j; n++) {
      nrg += (ARCoefQ12[j] * ((CorrQ7_norm[j - n] * ARCoefQ12[n] + 256) >> 9) +
          4) >> 3;
    }
    for (n = j + 1; n <= AR_ORDER; n++) {
      nrg += (ARCoefQ12[j] * ((CorrQ7_norm[n - j] * ARCoefQ12[n] + 256) >> 9) +
          4) >> 3;
    }
  }

  nrg_u32 = (uint32_t)nrg;
  if (shift_var > 0) {
    nrg_u32 = nrg_u32 >> shift_var;
  } else {
    nrg_u32 = nrg_u32 << (-shift_var);
  }
  if (nrg_u32 > 0x7FFFFFFF) {
    nrg = 0x7FFFFFFF;
  }  else {
    nrg = (int32_t)nrg_u32;
  }
  /* Also shifts 31 bits to the left! */
  gain2_Q10 = WebRtcSpl_DivResultInQ31(FRAMESAMPLES_QUARTER, nrg);

  /* Quantize & code gain2_Q10. */
  if (WebRtcIsac_EncodeGain2(&gain2_Q10, streamdata)) {
    return -1;
  }

  /* Compute inverse AR power spectrum. */
  FindInvArSpec(ARCoefQ12, gain2_Q10, invARSpec2_Q16);
  /* Convert to magnitude spectrum, by doing square-roots
   * (modified from SPLIB). */
  res = 1 << (WebRtcSpl_GetSizeInBits(invARSpec2_Q16[0]) >> 1);
  for (k = 0; k < FRAMESAMPLES_QUARTER; k++) {
    in_sqrt = invARSpec2_Q16[k];
    i = 10;
    /* Negative values make no sense for a real sqrt-function. */
    if (in_sqrt < 0) {
      in_sqrt = -in_sqrt;
    }
    newRes = (in_sqrt / res + res) >> 1;
    do {
      res = newRes;
      newRes = (in_sqrt / res + res) >> 1;
    } while (newRes != res && i-- > 0);

    invARSpecQ8[k] = (int16_t)newRes;
  }
  /* arithmetic coding of spectrum */
  err = WebRtcIsac_EncLogisticMulti2(streamdata, dataQ7, invARSpecQ8,
                                     num_dft_coeff, is_12khz);
  if (err < 0) {
    return (err);
  }
  return 0;
}